

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O2

Point shrinkChunk(Image *chunk)

{
  long lVar1;
  uint8_t uVar2;
  pointer pCVar3;
  Point PVar4;
  bool bVar5;
  long lVar6;
  uint8_t *puVar7;
  long lVar8;
  pointer pCVar9;
  Size size;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint8_t *puVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  pointer pCVar21;
  Point end;
  Image out;
  Point local_68;
  Point local_60;
  Image local_58;
  Size local_38;
  
  local_68.x = 0;
  local_68.y = 0;
  iVar17 = (chunk->size).width;
  lVar6 = (long)iVar17;
  local_60.y = (chunk->size).height;
  uVar18 = (ulong)local_60.y;
  pCVar3 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = 0;
  uVar10 = 0;
  if (0 < local_60.y) {
    uVar10 = local_60.y;
  }
  lVar1 = lVar6 * 4;
  pCVar9 = pCVar3;
  while (lVar11 < (long)uVar18) {
    lVar13 = 0;
    for (lVar20 = lVar6 >> 2; 0 < lVar20; lVar20 = lVar20 + -1) {
      if (0xffffff < *(uint *)(&pCVar9->r + lVar13)) {
        pCVar21 = (pointer)(&pCVar9->r + lVar13);
        goto LAB_0010c21a;
      }
      if (0xffffff < *(uint *)(&pCVar9[1].r + lVar13)) {
        pCVar21 = (pointer)(&pCVar9[1].r + lVar13);
        goto LAB_0010c21a;
      }
      if (0xffffff < *(uint *)(&pCVar9[2].r + lVar13)) {
        pCVar21 = (pointer)(&pCVar9[2].r + lVar13);
        goto LAB_0010c21a;
      }
      if (0xffffff < *(uint *)(&pCVar9[3].r + lVar13)) {
        pCVar21 = (pointer)(&pCVar9[3].r + lVar13);
        goto LAB_0010c21a;
      }
      lVar13 = lVar13 + 0x10;
    }
    lVar20 = lVar1 - lVar13 >> 2;
    pCVar21 = (pointer)(&pCVar9->r + lVar13);
    if (lVar20 == 1) {
LAB_0010c24c:
      if (0xffffff < (uint)*pCVar21) goto LAB_0010c21a;
    }
    else {
      if (lVar20 == 3) {
        if ((uint)*pCVar21 < 0x1000000) {
          pCVar21 = (pointer)(&pCVar9[1].r + lVar13);
          goto LAB_0010c23f;
        }
      }
      else {
        if (lVar20 != 2) goto LAB_0010c21f;
LAB_0010c23f:
        if ((uint)*pCVar21 < 0x1000000) {
          pCVar21 = pCVar21 + 1;
          goto LAB_0010c24c;
        }
      }
LAB_0010c21a:
      if (pCVar21 != pCVar3 + lVar11 * lVar6 + lVar6) {
        uVar10 = (uint)lVar11;
        break;
      }
    }
LAB_0010c21f:
    lVar11 = lVar11 + 1;
    local_68 = (Point)(lVar11 << 0x20);
    pCVar9 = pCVar9 + lVar6;
  }
  lVar11 = (long)(int)uVar10;
  lVar20 = (uVar18 - 1) * lVar6;
  iVar12 = local_60.y * iVar17;
  lVar13 = 0;
  while( true ) {
    uVar19 = uVar18 - 1;
    iVar16 = (int)uVar18;
    if ((long)uVar19 <= lVar11) break;
    lVar15 = lVar13;
    for (lVar8 = (long)((long)(iVar16 * iVar17) * 4 + uVar19 * lVar6 * -4) >> 4; 0 < lVar8;
        lVar8 = lVar8 + -1) {
      if (0xffffff < *(uint *)(&pCVar3[lVar20].r + lVar15)) {
        pCVar9 = (pointer)(&pCVar3[lVar20].r + lVar15);
        goto LAB_0010c333;
      }
      if (0xffffff < *(uint *)(&pCVar3[lVar20 + 1].r + lVar15)) {
        pCVar9 = (pointer)(&pCVar3[lVar20 + 1].r + lVar15);
        goto LAB_0010c333;
      }
      if (0xffffff < *(uint *)(&pCVar3[lVar20 + 2].r + lVar15)) {
        pCVar9 = (pointer)(&pCVar3[lVar20 + 2].r + lVar15);
        goto LAB_0010c333;
      }
      if (0xffffff < *(uint *)(&pCVar3[lVar20 + 3].r + lVar15)) {
        pCVar9 = (pointer)(&pCVar3[lVar20 + 3].r + lVar15);
        goto LAB_0010c333;
      }
      lVar15 = lVar15 + 0x10;
    }
    lVar8 = (lVar20 * -4 + (long)iVar12 * 4) - lVar15 >> 2;
    pCVar9 = (pointer)(&pCVar3[lVar20].r + lVar15);
    if (lVar8 == 1) {
LAB_0010c369:
      if (0xffffff < (uint)*pCVar9) goto LAB_0010c333;
    }
    else {
      if (lVar8 == 3) {
        if ((uint)*pCVar9 < 0x1000000) {
          pCVar9 = (pointer)(&pCVar3[lVar20 + 1].r + lVar15);
          goto LAB_0010c35c;
        }
      }
      else {
        if (lVar8 != 2) goto LAB_0010c338;
LAB_0010c35c:
        if ((uint)*pCVar9 < 0x1000000) {
          pCVar9 = pCVar9 + 1;
          goto LAB_0010c369;
        }
      }
LAB_0010c333:
      if (pCVar9 != pCVar3 + iVar16 * iVar17) break;
    }
LAB_0010c338:
    local_60.y = (int)uVar19;
    lVar13 = lVar13 + lVar6 * -4;
    iVar12 = iVar12 - iVar17;
    uVar18 = uVar19;
  }
  puVar7 = &pCVar3[lVar6 * lVar11].a;
  for (lVar20 = 0; lVar13 = lVar11 + -1, puVar14 = puVar7, lVar20 < lVar6; lVar20 = lVar20 + 1) {
    while (lVar13 + 1 < (long)iVar16) {
      uVar2 = *puVar14;
      lVar13 = lVar13 + 1;
      puVar14 = puVar14 + lVar1;
      if (uVar2 != '\0') goto LAB_0010c3b5;
    }
    puVar7 = puVar7 + 4;
  }
LAB_0010c3b5:
  local_68.x = (int)lVar20;
  puVar7 = &pCVar3[(lVar11 + 1) * lVar6 + -1].a;
  while (lVar13 = lVar11 + -1, puVar14 = puVar7, (long)(int)lVar20 < lVar6 + -1) {
    while (lVar13 + 1 < (long)iVar16) {
      uVar2 = *puVar14;
      lVar13 = lVar13 + 1;
      puVar14 = puVar14 + lVar1;
      if (uVar2 != '\0') goto LAB_0010c3fa;
    }
    puVar7 = puVar7 + -4;
    lVar6 = lVar6 + -1;
  }
LAB_0010c3fa:
  local_60.x = (int)lVar6;
  local_58.size.width = 0;
  local_58.size.height = 0;
  bVar5 = Point::operator==(&local_68,(Point *)&local_58);
  if (bVar5) {
    local_38 = chunk->size;
    bVar5 = Point::operator==(&local_60,(Point *)&local_38);
    if (!bVar5) {
      uVar18 = (ulong)(uint)local_60.y;
      goto LAB_0010c431;
    }
  }
  else {
LAB_0010c431:
    iVar17 = (int)uVar18 - local_68.y;
    if (iVar17 != 0) {
      size.width = local_60.x - local_68.x;
      size.height = iVar17;
      Image::Image(&local_58,size,(Color)0x0);
      Image::drawOnto(chunk,&local_58,(Point)0x0,local_68,local_58.size);
      Image::operator=(chunk,&local_58);
      PVar4 = local_68;
      uVar18 = (ulong)local_68 & 0xffffffff;
      std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                (&local_58.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
      uVar19 = (ulong)PVar4 & 0xffffffff00000000;
      goto LAB_0010c4a5;
    }
    Image::fastResize(chunk,(Size)0x100000001);
  }
  uVar18 = 0;
  uVar19 = 0;
LAB_0010c4a5:
  return (Point)(uVar18 | uVar19);
}

Assistant:

Point shrinkChunk(Image& chunk) {
	Point start {0, 0};
	Point end {chunk.size.width, chunk.size.height};
	for (; start.y < end.y; start.y++) { // Shrink from top
		if (std::any_of(&chunk.pixel(start.x, start.y), &chunk.pixel(end.x, start.y), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.y < end.y - 1; end.y--) { // Shrink from bottom
		if (std::any_of(&chunk.pixel(start.x, end.y - 1), &chunk.pixel(end.x, end.y - 1), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.x < end.x; start.x++) { // Shrink from left
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(start.x, y).a > 0)
				goto leftfound;
		}
	}
leftfound:
	for(; start.x < end.x - 1; end.x--) { // Shrink from right
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(end.x - 1, y).a > 0)
				goto rightfound;
		}
	}
rightfound:
	if (start == Point{0, 0} && end == Point{chunk.size.width, chunk.size.height}) {
		// No resizing possible
		return {0, 0};
	} else if (start.y == end.y) {
		// TODO: Be able to remove empty chunks
		chunk.fastResize({1, 1});
		return {0, 0};
	} else {
		Image out({end.x - start.x, end.y - start.y});
		chunk.drawOnto(out, {0, 0}, {start.x, start.y}, out.size);
		chunk = std::move(out);
		return {start.x, start.y};
	}
}